

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# muxinternal.c
# Opt level: O3

WebPMuxError MuxImageDeleteNth(WebPMuxImage **wpi_list,uint32_t nth)

{
  WebPMuxError WVar1;
  WebPMuxImage *pWVar2;
  WebPMuxImage *wpi;
  int iVar3;
  
  wpi = *wpi_list;
  if (nth == 0) {
    if (wpi == (WebPMuxImage *)0x0) {
      return WEBP_MUX_NOT_FOUND;
    }
    nth = 0;
    pWVar2 = wpi;
    do {
      nth = nth + 1;
      pWVar2 = pWVar2->next;
    } while (pWVar2 != (WebPMuxImage *)0x0);
  }
  WVar1 = WEBP_MUX_NOT_FOUND;
  if (wpi != (WebPMuxImage *)0x0) {
    if (nth != 1) {
      iVar3 = nth - 1;
      do {
        pWVar2 = wpi;
        wpi = pWVar2->next;
        if (wpi == (WebPMuxImage *)0x0) {
          return WEBP_MUX_NOT_FOUND;
        }
        iVar3 = iVar3 + -1;
      } while (iVar3 != 0);
      wpi_list = &pWVar2->next;
    }
    pWVar2 = MuxImageRelease(wpi);
    WebPSafeFree(wpi);
    *wpi_list = pWVar2;
    WVar1 = WEBP_MUX_OK;
  }
  return WVar1;
}

Assistant:

WebPMuxError MuxImageDeleteNth(WebPMuxImage** wpi_list, uint32_t nth) {
  assert(wpi_list);
  if (!SearchImageToGetOrDelete(wpi_list, nth, &wpi_list)) {
    return WEBP_MUX_NOT_FOUND;
  }
  *wpi_list = MuxImageDelete(*wpi_list);
  return WEBP_MUX_OK;
}